

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenByteBufferLength_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,char *bb_name)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,bb_name,&local_11);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GenByteBufferLength(const char *bb_name) const {
    std::string bb_len = bb_name;
    bb_len += ".capacity()";
    return bb_len;
  }